

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryBefore(CollationRootElements *this,uint32_t p,uint32_t s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int32_t iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  uint32_t *puVar9;
  
  if (p == 0) {
    puVar9 = this->elements;
    lVar7 = (long)(int)puVar9[1];
    uVar6 = (ulong)puVar9[lVar7];
    uVar5 = 0;
  }
  else {
    iVar4 = findP(this,p);
    puVar9 = this->elements;
    uVar1 = puVar9[(long)iVar4 + 1];
    lVar7 = (long)iVar4 + 1;
    uVar2 = uVar1;
    if (0x50004ff < uVar1) {
      uVar2 = 0x5000500;
    }
    uVar6 = (ulong)uVar2;
    if (-1 < (char)uVar1) {
      uVar6 = 0x5000500;
    }
    uVar5 = 0x100;
  }
  puVar8 = puVar9 + lVar7;
  while (uVar3 = uVar6 >> 0x10, (uint)(uVar6 >> 0x10) < s) {
    uVar1 = *puVar8;
    puVar8 = puVar8 + 1;
    uVar5 = uVar3;
    uVar6 = (ulong)uVar1;
  }
  return (uint32_t)uVar5;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryBefore(uint32_t p, uint32_t s) const {
    int32_t index;
    uint32_t previousSec, sec;
    if(p == 0) {
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        // Gap at the beginning of the secondary CE range.
        previousSec = 0;
        sec = elements[index] >> 16;
    } else {
        index = findPrimary(p) + 1;
        previousSec = Collation::BEFORE_WEIGHT16;
        sec = getFirstSecTerForPrimary(index) >> 16;
    }
    U_ASSERT(s >= sec);
    while(s > sec) {
        previousSec = sec;
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        sec = elements[index++] >> 16;
    }
    U_ASSERT(sec == s);
    return previousSec;
}